

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::LateMaterialization::GetExpression
          (LateMaterialization *this,LogicalOperator *op,idx_t column_index)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  LogicalGet *this_00;
  vector<duckdb::ColumnIndex,_true> *this_01;
  const_reference index;
  string *psVar3;
  LogicalType *args_1;
  reference this_02;
  pointer pEVar4;
  InternalException *this_03;
  size_type in_RCX;
  templated_unique_single_t expr;
  string column_name;
  _func_int **local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  ColumnBinding local_40;
  
  if (*(char *)(column_index + 8) == '\x01') {
    this_02 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                            *)(column_index + 0x28),in_RCX);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_02);
    (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(this,pEVar4);
  }
  else {
    if (*(char *)(column_index + 8) != '\x19') {
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "Unsupported operator type for LateMaterialization::GetExpression","");
      InternalException::InternalException(this_03,&local_60);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = LogicalOperator::Cast<duckdb::LogicalGet>((LogicalOperator *)column_index);
    this_01 = LogicalGet::GetColumnIds(this_00);
    index = vector<duckdb::ColumnIndex,_true>::operator[](this_01,in_RCX);
    psVar3 = LogicalGet::GetColumnName_abi_cxx11_(this_00,index);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + psVar3->_M_string_length);
    args_1 = LogicalGet::GetColumnType(this_00,index);
    local_40.table_index = this_00->table_index;
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string&,duckdb::LogicalType_const&,duckdb::ColumnBinding>
              ((duckdb *)&local_68,&local_60,args_1,&local_40);
    pp_Var2 = local_68;
    local_68 = (_func_int **)0x0;
    (this->super_BaseColumnPruner).super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
         pp_Var2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> LateMaterialization::GetExpression(LogicalOperator &op, idx_t column_index) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_GET: {
		auto &get = op.Cast<LogicalGet>();
		auto &column_id = get.GetColumnIds()[column_index];
		auto column_name = get.GetColumnName(column_id);
		auto &column_type = get.GetColumnType(column_id);
		auto expr =
		    make_uniq<BoundColumnRefExpression>(column_name, column_type, ColumnBinding(get.table_index, column_index));
		return std::move(expr);
	}
	case LogicalOperatorType::LOGICAL_PROJECTION:
		return op.expressions[column_index]->Copy();
	default:
		throw InternalException("Unsupported operator type for LateMaterialization::GetExpression");
	}
}